

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

void RemoveOpenStream(PaStream *stream)

{
  PaUtilStreamRepresentation *local_20;
  PaUtilStreamRepresentation *current;
  PaUtilStreamRepresentation *previous;
  PaStream *stream_local;
  
  current = (PaUtilStreamRepresentation *)0x0;
  local_20 = firstOpenStream_;
  while( true ) {
    if (local_20 == (PaUtilStreamRepresentation *)0x0) {
      return;
    }
    if (local_20 == (PaUtilStreamRepresentation *)stream) break;
    current = local_20;
    local_20 = local_20->nextOpenStream;
  }
  if (current == (PaUtilStreamRepresentation *)0x0) {
    firstOpenStream_ = local_20->nextOpenStream;
    return;
  }
  current->nextOpenStream = local_20->nextOpenStream;
  return;
}

Assistant:

static void RemoveOpenStream( PaStream* stream )
{
    PaUtilStreamRepresentation *previous = NULL;
    PaUtilStreamRepresentation *current = firstOpenStream_;

    while( current != NULL )
    {
        if( ((PaStream*)current) == stream )
        {
            if( previous == NULL )
            {
                firstOpenStream_ = current->nextOpenStream;
            }
            else
            {
                previous->nextOpenStream = current->nextOpenStream;
            }
            return;
        }
        else
        {
            previous = current;
            current = current->nextOpenStream;
        }
    }
}